

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O3

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> __thiscall
slang::ast::AttributeSymbol::fromSyntax
          (AttributeSymbol *this,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax,
          Scope *scope,Symbol *symbol)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this_00;
  char *pcVar1;
  long lVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  uint uVar4;
  Symbol *pSVar5;
  BumpAllocator *pBVar6;
  Compilation **ppCVar7;
  size_t sVar8;
  char *pcVar9;
  value_type *pvVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar14;
  ConstantValue *args_2;
  uint64_t uVar15;
  ulong uVar16;
  Diagnostic *this_01;
  undefined4 extraout_var;
  __extent_storage<18446744073709551615UL> _Var18;
  Scope *extraout_RDX;
  long lVar19;
  Scope *extraout_RDX_00;
  Scope *extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong uVar20;
  __extent_storage<18446744073709551615UL> src;
  size_type __rlen_1;
  Scope *pSVar21;
  ulong uVar22;
  size_type __rlen;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  string_view sVar41;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar42;
  try_emplace_args_t local_231;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_230;
  uint local_228;
  undefined2 local_224;
  string_view name;
  AttributeSymbol *attr;
  uint64_t local_208;
  size_t pos;
  Scope *local_1f8;
  BumpAllocator *local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  value_type *elements;
  ulong local_1d0;
  size_t pos_1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  locator res;
  SmallVector<const_slang::ast::AttributeSymbol_*,_5UL> attrs;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  nameMap;
  pointer ppAVar17;
  
  _Var18 = syntax._M_extent._M_extent_value;
  if (syntax._M_ptr == (pointer)0x0) {
    _Var18._M_extent_value = 0;
    ppAVar17 = (pointer)0x0;
  }
  else {
    nameMap.super_Storage.ptr = (char *)&nameMap;
    nameMap._112_8_ = 0x3f;
    nameMap._120_8_ = 1;
    nameMap._128_16_ = ZEXT816(0x4619b0);
    nameMap._144_16_ = (undefined1  [16])0x0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len = 0;
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.cap = 5;
    local_1f0 = *(BumpAllocator **)_Var18._M_extent_value;
    pSVar5 = &this->super_Symbol;
    pBVar6 = local_1f0 + 0xd;
    src._M_extent_value = _Var18._M_extent_value;
    nameMap.super_Storage._104_8_ = nameMap.super_Storage.ptr;
    do {
      lVar2 = *(long *)&this->super_Symbol;
      local_1d0 = *(long *)(lVar2 + 0x68) + 1;
      if (1 < local_1d0) {
        local_1d0 = local_1d0 >> 1;
        uVar22 = 0;
        do {
          ppSVar14 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )(uVar22 * 0x30 + *(long *)(lVar2 + 0x60)));
          pSVar3 = *ppSVar14;
          this_00 = pSVar3 + 1;
          sVar41 = parsing::Token::valueText((Token *)this_00);
          src._M_extent_value = (size_t)sVar41._M_str;
          name = sVar41;
          if (sVar41._M_len != 0) {
            if (pSVar3[1].previewNode == (SyntaxNode *)0x0) {
              local_228 = 1;
              local_224 = 0;
              local_230.val = 1;
              SVInt::clearUnusedBits((SVInt *)&local_230);
              auVar23 = (undefined1  [16])res._0_16_;
              res.n = local_228;
              res._14_2_ = auVar23._14_2_;
              res._12_2_ = local_224;
              res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_230.val;
              local_230 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this_00);
              args_2 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                 ((TypedBumpAllocator<slang::ConstantValue> *)&pBVar6->endPtr,
                                  (ConstantValue *)&res);
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ConstantValue&>
                               (local_1f0,&name,(SourceLocation *)&local_230,args_2);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&res);
            }
            else {
              local_230 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                          parsing::Token::location((Token *)this_00);
              res._0_16_ = sVar41;
              attr = BumpAllocator::
                     emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax&>
                               (local_1f0,(basic_string_view<char,_std::char_traits<char>_> *)&res,
                                (SourceLocation *)&local_230,(Symbol *)scope,
                                (ExpressionSyntax *)pSVar3[1].previewNode[1].previewNode);
            }
            (attr->super_Symbol).originatingSyntax = pSVar3;
            uVar15 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&nameMap.super_Storage.field_0x68,&name);
            uVar20 = uVar15 >> (nameMap._112_1_ & 0x3f);
            lVar19 = (uVar15 & 0xff) * 4;
            cVar25 = (&UNK_00461acc)[lVar19];
            cVar26 = (&UNK_00461acd)[lVar19];
            cVar27 = (&UNK_00461ace)[lVar19];
            cVar28 = (&UNK_00461acf)[lVar19];
            elements = (value_type *)nameMap._136_8_;
            sVar8 = name._M_len;
            pcVar9 = name._M_str;
            local_1e8 = (ulong)((uint)uVar15 & 7);
            local_1f8 = (Scope *)nameMap._120_8_;
            pSVar21 = (Scope *)0x0;
            local_208 = nameMap._128_8_;
            cVar29 = cVar25;
            cVar30 = cVar26;
            cVar31 = cVar27;
            cVar32 = cVar28;
            cVar33 = cVar25;
            cVar34 = cVar26;
            cVar35 = cVar27;
            cVar36 = cVar28;
            cVar37 = cVar25;
            cVar38 = cVar26;
            cVar39 = cVar27;
            cVar40 = cVar28;
            do {
              pvVar10 = elements;
              pcVar1 = (char *)(local_208 + uVar20 * 0x10);
              auVar23[0] = -(*pcVar1 == cVar25);
              auVar23[1] = -(pcVar1[1] == cVar26);
              auVar23[2] = -(pcVar1[2] == cVar27);
              auVar23[3] = -(pcVar1[3] == cVar28);
              auVar23[4] = -(pcVar1[4] == cVar29);
              auVar23[5] = -(pcVar1[5] == cVar30);
              auVar23[6] = -(pcVar1[6] == cVar31);
              auVar23[7] = -(pcVar1[7] == cVar32);
              auVar23[8] = -(pcVar1[8] == cVar33);
              auVar23[9] = -(pcVar1[9] == cVar34);
              auVar23[10] = -(pcVar1[10] == cVar35);
              auVar23[0xb] = -(pcVar1[0xb] == cVar36);
              auVar23[0xc] = -(pcVar1[0xc] == cVar37);
              auVar23[0xd] = -(pcVar1[0xd] == cVar38);
              auVar23[0xe] = -(pcVar1[0xe] == cVar39);
              auVar23[0xf] = -(pcVar1[0xf] == cVar40);
              local_1e0 = CONCAT71(local_1e0._1_7_,pcVar1[0xf]);
              uVar12 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
              pos = uVar20;
              if (uVar12 != 0) {
                pos_1 = CONCAT17(cVar32,CONCAT16(cVar31,CONCAT15(cVar30,CONCAT14(cVar29,CONCAT13(
                                                  cVar28,CONCAT12(cVar27,CONCAT11(cVar26,cVar25)))))
                                                ));
                cStack_1c0 = cVar33;
                cStack_1bf = cVar34;
                cStack_1be = cVar35;
                cStack_1bd = cVar36;
                cStack_1bc = cVar37;
                cStack_1bb = cVar38;
                cStack_1ba = cVar39;
                cStack_1b9 = cVar40;
                do {
                  uVar4 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  uVar16 = (ulong)uVar4;
                  if (sVar8 == pvVar10[uVar20 * 0xf + uVar16].first._M_len) {
                    if (sVar8 != 0) {
                      iVar13 = bcmp(pcVar9,pvVar10[uVar20 * 0xf + uVar16].first._M_str,sVar8);
                      cVar25 = (char)pos_1;
                      cVar26 = pos_1._1_1_;
                      cVar27 = pos_1._2_1_;
                      cVar28 = pos_1._3_1_;
                      cVar29 = pos_1._4_1_;
                      cVar30 = pos_1._5_1_;
                      cVar31 = pos_1._6_1_;
                      cVar32 = pos_1._7_1_;
                      cVar33 = cStack_1c0;
                      cVar34 = cStack_1bf;
                      cVar35 = cStack_1be;
                      cVar36 = cStack_1bd;
                      cVar37 = cStack_1bc;
                      cVar38 = cStack_1bb;
                      cVar39 = cStack_1ba;
                      cVar40 = cStack_1b9;
                      if (iVar13 != 0) goto LAB_003a0ad7;
                    }
                    this_01 = Scope::addDiag((Scope *)_Var18._M_extent_value,(DiagCode)0xed0006,
                                             (attr->super_Symbol).location);
                    Diagnostic::operator<<(this_01,name);
                    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_
                    [pvVar10[uVar20 * 0xf + uVar16].second] = attr;
                    src._M_extent_value =
                         (size_t)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.
                                 data_;
                    goto LAB_003a08cc;
                  }
LAB_003a0ad7:
                  uVar12 = uVar12 - 1 & uVar12;
                } while (uVar12 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_1e8] & (byte)local_1e0) == 0)
              break;
              ppCVar7 = &pSVar21->compilation;
              pSVar21 = (Scope *)((long)&pSVar21->compilation + 1);
              uVar20 = (long)ppCVar7 + pos + 1 & (ulong)local_1f8;
            } while (pSVar21 <= local_1f8);
            SmallVectorBase<slang::ast::AttributeSymbol_const*>::
            emplace_back<slang::ast::AttributeSymbol_const*const&>
                      ((SmallVectorBase<slang::ast::AttributeSymbol_const*> *)&attrs,&attr);
            local_230.pVal =
                 (uint64_t *)
                 (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.len - 1);
            local_208 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&nameMap.super_Storage.field_0x68,&name);
            uVar11 = nameMap._120_8_;
            src._M_extent_value = local_208 >> (nameMap._112_1_ & 0x3f);
            lVar19 = (local_208 & 0xff) * 4;
            cVar25 = (&UNK_00461acc)[lVar19];
            cVar26 = (&UNK_00461acd)[lVar19];
            cVar27 = (&UNK_00461ace)[lVar19];
            cVar28 = (&UNK_00461acf)[lVar19];
            local_1e0 = (ulong)((uint)local_208 & 7);
            pos = nameMap._136_8_;
            sVar8 = name._M_len;
            pcVar9 = name._M_str;
            uVar20 = 0;
            local_1e8 = nameMap._128_8_;
            local_1f8 = (Scope *)src._M_extent_value;
            do {
              pcVar1 = (char *)(local_1e8 + src._M_extent_value * 0x10);
              auVar24[0] = -(*pcVar1 == cVar25);
              auVar24[1] = -(pcVar1[1] == cVar26);
              auVar24[2] = -(pcVar1[2] == cVar27);
              auVar24[3] = -(pcVar1[3] == cVar28);
              auVar24[4] = -(pcVar1[4] == cVar25);
              auVar24[5] = -(pcVar1[5] == cVar26);
              auVar24[6] = -(pcVar1[6] == cVar27);
              auVar24[7] = -(pcVar1[7] == cVar28);
              auVar24[8] = -(pcVar1[8] == cVar25);
              auVar24[9] = -(pcVar1[9] == cVar26);
              auVar24[10] = -(pcVar1[10] == cVar27);
              auVar24[0xb] = -(pcVar1[0xb] == cVar28);
              auVar24[0xc] = -(pcVar1[0xc] == cVar25);
              auVar24[0xd] = -(pcVar1[0xd] == cVar26);
              auVar24[0xe] = -(pcVar1[0xe] == cVar27);
              auVar24[0xf] = -(pcVar1[0xf] == cVar28);
              elements = (value_type *)CONCAT71(elements._1_7_,pcVar1[0xf]);
              uVar12 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
              pos_1 = src._M_extent_value;
              if (uVar12 != 0) {
                lVar19 = pos + src._M_extent_value * 0x168;
                do {
                  uVar4 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  if ((sVar8 == *(size_t *)(lVar19 + (ulong)uVar4 * 0x18)) &&
                     ((sVar8 == 0 ||
                      (iVar13 = bcmp(pcVar9,*(void **)(lVar19 + 8 + (ulong)uVar4 * 0x18),sVar8),
                      src._M_extent_value = (size_t)extraout_RDX, iVar13 == 0)))) goto LAB_003a08cc;
                  uVar12 = uVar12 - 1 & uVar12;
                } while (uVar12 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_1e0] & (byte)elements) == 0)
              break;
              lVar19 = pos_1 + uVar20;
              uVar20 = uVar20 + 1;
              src._M_extent_value = lVar19 + 1U & uVar11;
            } while (uVar20 <= (ulong)uVar11);
            if ((ulong)nameMap._152_8_ < (ulong)nameMap._144_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                        (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                               *)&nameMap.super_Storage.field_0x68,
                         (arrays_type *)&nameMap.field_0x70,(size_t)local_1f8,local_208,&local_231,
                         &name,&local_230.val);
              nameMap._152_8_ = nameMap._152_8_ + 1;
              src._M_extent_value = (size_t)extraout_RDX_00;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long>
                        (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,96ul,16ul>>
                               *)&nameMap.super_Storage.field_0x68,local_208,&local_231,&name,
                         &local_230.val);
              src._M_extent_value = (size_t)extraout_RDX_01;
            }
          }
LAB_003a08cc:
          uVar22 = uVar22 + 1;
        } while (uVar22 != local_1d0);
      }
      this = (AttributeSymbol *)&(this->super_Symbol).name;
    } while (this != (AttributeSymbol *)(&pSVar5->kind + (long)syntax._M_ptr * 2));
    iVar13 = SmallVectorBase<const_slang::ast::AttributeSymbol_*>::copy
                       (&attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>,
                        (EVP_PKEY_CTX *)local_1f0,(EVP_PKEY_CTX *)src._M_extent_value);
    ppAVar17 = (pointer)CONCAT44(extraout_var,iVar13);
    if (attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ !=
        (pointer)attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.firstElement) {
      operator_delete(attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_);
    }
    attrs.super_SmallVectorBase<const_slang::ast::AttributeSymbol_*>.data_ =
         (pointer)nameMap.super_Storage._104_8_;
    _Var18._M_extent_value = extraout_RDX_02;
    if (nameMap._136_8_ != 0) {
      slang::detail::hashing::
      StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
      ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
                    *)&attrs,
                   (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    *)nameMap._136_8_,(nameMap._120_8_ * 0x178 + 0x186U) / 0x18);
    }
  }
  sVar42._M_extent._M_extent_value = _Var18._M_extent_value;
  sVar42._M_ptr = ppAVar17;
  return sVar42;
}

Assistant:

std::span<const AttributeSymbol* const> AttributeSymbol::fromSyntax(
    std::span<const AttributeInstanceSyntax* const> syntax, const Scope& scope,
    const Symbol& symbol) {

    if (syntax.empty())
        return {};

    return createAttributes(
        syntax, scope, [&symbol](auto& comp, auto name, auto loc, auto& exprSyntax) {
            return comp.template emplace<AttributeSymbol>(name, loc, symbol, exprSyntax);
        });
}